

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void common_kv_cache_dump_view(llama_kv_cache_view *view,int row_size)

{
  unsigned_long *puVar1;
  int in_ESI;
  uint *in_RDI;
  int j;
  int seq_count;
  int i;
  llama_seq_id *cs_curr;
  llama_kv_cache_view_cell *c_curr;
  unsigned_long local_40 [2];
  int local_2c;
  int local_28;
  uint local_24;
  long local_20;
  long local_18;
  int local_c;
  uint *local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  printf("=== Dumping KV cache. total cells %d, max sequences per cell %d, populated cells %d, total tokens in cache %d, largest empty slot=%d @ %d"
         ,(ulong)*in_RDI,(ulong)in_RDI[1],(ulong)in_RDI[3],(ulong)in_RDI[2],(ulong)in_RDI[4],
         in_RDI[5]);
  local_18 = *(long *)(local_8 + 6);
  local_20 = *(long *)(local_8 + 8);
  for (local_24 = 0; (int)local_24 < (int)*local_8; local_24 = local_24 + 1) {
    if ((int)local_24 % local_c == 0) {
      printf("\n%5d: ",(ulong)local_24);
    }
    local_28 = 0;
    for (local_2c = 0; local_2c < (int)local_8[1]; local_2c = local_2c + 1) {
      if (-1 < *(int *)(local_20 + (long)local_2c * 4)) {
        local_28 = local_28 + 1;
      }
    }
    local_40[1] = 0x3e;
    local_40[0] = (unsigned_long)local_28;
    puVar1 = std::min<unsigned_long>(local_40 + 1,local_40);
    putchar((int)".123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz+"[*puVar1]);
    local_18 = local_18 + 4;
    local_20 = local_20 + (long)(int)local_8[1] * 4;
  }
  printf("\n=== Done dumping\n");
  return;
}

Assistant:

void common_kv_cache_dump_view(const llama_kv_cache_view & view, int row_size) {
    static const char slot_chars[] = ".123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz+";

    printf("=== Dumping KV cache. total cells %d, max sequences per cell %d, populated cells %d, total tokens in cache %d, largest empty slot=%d @ %d",
        view.n_cells, view.n_seq_max, view.used_cells, view.token_count, view.max_contiguous, view.max_contiguous_idx);

    llama_kv_cache_view_cell * c_curr = view.cells;
    llama_seq_id * cs_curr = view.cells_sequences;

    for (int i = 0; i < view.n_cells; i++, c_curr++, cs_curr += view.n_seq_max) {
        if (i % row_size == 0) {
            printf("\n%5d: ", i);
        }
        int seq_count = 0;
        for (int j = 0; j < view.n_seq_max; j++) {
            if (cs_curr[j] >= 0) { seq_count++; }
        }
        putchar(slot_chars[std::min(sizeof(slot_chars) - 2, size_t(seq_count))]);
    }

    printf("\n=== Done dumping\n");
}